

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_sync_processor_impl_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_service *tservice)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  rust_camel_case(&local_38,this,(string *)CONCAT44(extraout_var,iVar1));
  std::operator+(&bStack_58,"T",&local_38);
  std::operator+(__return_storage_ptr__,&bStack_58,"ProcessFunctions");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_sync_processor_impl_name(t_service *tservice) {
  return "T" + rust_camel_case(tservice->get_name()) + "ProcessFunctions";
}